

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

block_s * block_new(void)

{
  fio_ls_embd_s *pfVar1;
  int local_24;
  block_s *pbStack_20;
  int i;
  block_node_s *tmp;
  block_s *blk;
  
  fio_lock(&memory.lock);
  pfVar1 = fio_ls_embd_pop(&memory.available);
  if (pfVar1 == (fio_ls_embd_s *)0x0) {
    blk = (block_s *)sys_alloc(0x800000,'\0');
    if (blk == (block_s *)0x0) {
      fio_unlock(&memory.lock);
      blk = (block_s *)0x0;
    }
    else {
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7170): memory allocator allocated %p from the system"
                       ,blk);
      }
      block_init_root(blk,blk);
      pbStack_20 = blk;
      for (local_24 = 1; local_24 < 0x100; local_24 = local_24 + 1) {
        block_init_root(pbStack_20 + 0x800,blk);
        fio_ls_embd_push(&memory.available,(fio_ls_embd_s *)(pbStack_20 + 0x801));
        pbStack_20 = pbStack_20 + 0x800;
      }
      fio_unlock(&memory.lock);
    }
  }
  else {
    blk = (block_s *)(pfVar1 + -1);
    if (((ulong)blk & 0x7fff) != 0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7159) Memory allocator error! double `fio_free`?\n"
                      );
      }
      perror("     errno");
      exit(-1);
    }
    block_init(blk);
    fio_unlock(&memory.lock);
  }
  return blk;
}

Assistant:

static inline block_s *block_new(void) {
  block_s *blk = NULL;

  fio_lock(&memory.lock);
  blk = (block_s *)fio_ls_embd_pop(&memory.available);
  if (blk) {
    blk = (block_s *)FIO_LS_EMBD_OBJ(block_node_s, node, blk);
    FIO_ASSERT(((uintptr_t)blk & FIO_MEMORY_BLOCK_MASK) == 0,
               "Memory allocator error! double `fio_free`?\n");
    block_init(blk); /* must be performed within lock */
    fio_unlock(&memory.lock);
    return blk;
  }
  /* collect memory from the system */
  blk = sys_alloc(FIO_MEMORY_BLOCK_SIZE * FIO_MEMORY_BLOCKS_PER_ALLOCATION, 0);
  if (!blk) {
    fio_unlock(&memory.lock);
    return NULL;
  }
  FIO_LOG_DEBUG("memory allocator allocated %p from the system", (void *)blk);
  FIO_MEMORY_ON_BLOCK_ALLOC();
  block_init_root(blk, blk);
  /* the extra memory goes into the memory pool. initialize + linke-list. */
  block_node_s *tmp = (block_node_s *)blk;
  for (int i = 1; i < FIO_MEMORY_BLOCKS_PER_ALLOCATION; ++i) {
    tmp = (block_node_s *)((uintptr_t)tmp + FIO_MEMORY_BLOCK_SIZE);
    block_init_root((block_s *)tmp, blk);
    fio_ls_embd_push(&memory.available, &tmp->node);
  }
  fio_unlock(&memory.lock);
  /* return the root block (which isn't in the memory pool). */
  return blk;
}